

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.h
# Opt level: O2

QDBusArgument * operator<<(QDBusArgument *arg,QList<QDBusMenuLayoutItem> *list)

{
  QDBusMenuLayoutItem *item;
  long lVar1;
  
  QDBusArgument::beginArray((QMetaType)arg);
  item = (list->d).ptr;
  for (lVar1 = (list->d).size * 0x28; lVar1 != 0; lVar1 = lVar1 + -0x28) {
    operator<<(arg,item);
    item = item + 1;
  }
  QDBusArgument::endArray();
  return arg;
}

Assistant:

inline QDBusArgument &operator<<(QDBusArgument &arg, const Container<T> &list)
{
    arg.beginArray(QMetaType::fromType<T>());
    typename Container<T>::const_iterator it = list.begin();
    typename Container<T>::const_iterator end = list.end();
    for ( ; it != end; ++it)
        arg << *it;
    arg.endArray();
    return arg;
}